

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

msgpack_unpack_return
msgpack_unpacker_next_with_size(msgpack_unpacker *mpac,msgpack_unpacked *result,size_t *p_bytes)

{
  void *pvVar1;
  msgpack_unpack_return mVar2;
  
  mVar2 = unpacker_next(mpac,result);
  if (((mVar2 & ~MSGPACK_UNPACK_SUCCESS) == MSGPACK_UNPACK_CONTINUE) &&
     (*p_bytes = mpac->parsed, mVar2 == MSGPACK_UNPACK_SUCCESS)) {
    pvVar1 = mpac->ctx;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    *(undefined4 *)((long)pvVar1 + 0x18) = 0;
    *(undefined4 *)((long)pvVar1 + 0x20) = 0;
    mpac->parsed = 0;
  }
  return mVar2;
}

Assistant:

msgpack_unpack_return
msgpack_unpacker_next_with_size(msgpack_unpacker* mpac,
                                msgpack_unpacked* result, size_t *p_bytes)
{
    int ret;

    ret = unpacker_next(mpac, result);
    if (ret == MSGPACK_UNPACK_SUCCESS || ret == MSGPACK_UNPACK_CONTINUE) {
        *p_bytes = mpac->parsed;
    }

    if (ret == MSGPACK_UNPACK_SUCCESS) {
        msgpack_unpacker_reset(mpac);
    }

    return ret;
}